

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

size_t __thiscall ThreadContext::GetStackLimitForCurrentThread(ThreadContext *this)

{
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  StackProber *pSVar4;
  size_t sVar5;
  undefined4 *puVar6;
  size_t limit;
  ThreadContext *this_local;
  
  sVar1 = this->stackLimitForCurrentThread;
  if (sVar1 != 0x7fffffffffffffff) {
    pSVar4 = GetStackProber(this);
    if (pSVar4 != (StackProber *)0x0) {
      pSVar4 = GetStackProber(this);
      sVar5 = StackProber::GetScriptStackLimit(pSVar4);
      if (sVar1 != sVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                           ,0x638,
                           "(limit == Js::Constants::StackLimitForScriptInterrupt || !this->GetStackProber() || limit == this->GetStackProber()->GetScriptStackLimit())"
                           ,
                           "limit == Js::Constants::StackLimitForScriptInterrupt || !this->GetStackProber() || limit == this->GetStackProber()->GetScriptStackLimit()"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
  }
  return sVar1;
}

Assistant:

size_t
 ThreadContext::GetStackLimitForCurrentThread() const
{
    FAULTINJECT_SCRIPT_TERMINATION;
    size_t limit = this->stackLimitForCurrentThread;
    Assert(limit == Js::Constants::StackLimitForScriptInterrupt
        || !this->GetStackProber()
        || limit == this->GetStackProber()->GetScriptStackLimit());
    return limit;
}